

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamahaCommands.hpp
# Opt level: O2

void __thiscall TI::TMS::Commands::Line::advance(Line *this)

{
  Vector *pVVar1;
  int *piVar2;
  CommandContext *pCVar3;
  int iVar4;
  
  pCVar3 = (this->super_Command).context;
  pVVar1 = &pCVar3->size;
  pVVar1->v[0] = pVVar1->v[0] + -1;
  (this->super_Command).cycles = 0x58;
  if ((pCVar3->arguments & 1) == 0) {
    Command::advance_axis<0,false>(&this->super_Command,1);
  }
  else {
    Command::advance_axis<1,false>(&this->super_Command,1);
  }
  iVar4 = this->position_ - this->numerator_;
  this->position_ = iVar4;
  if (-1 < iVar4) {
    return;
  }
  this->position_ = iVar4 + this->denominator_;
  piVar2 = &(this->super_Command).cycles;
  *piVar2 = *piVar2 + 0x20;
  if ((((this->super_Command).context)->arguments & 1) == 0) {
    Command::advance_axis<1,false>(&this->super_Command,1);
    return;
  }
  Command::advance_axis<0,false>(&this->super_Command,1);
  return;
}

Assistant:

void advance() final {
			--context.size.v[0];
			cycles = 88;

			// b0:	1 => long direction is y;
			//		0 => long direction is x.
			//
			// b2:	1 => x direction is left;
			//		0 => x direction is right.
			//
			// b3:	1 => y direction is up;
			//		0 => y direction is down.
			if(context.arguments & 0x1) {
				advance_axis<1, false>();
			} else {
				advance_axis<0, false>();
			}

			position_ -= numerator_;
			if(position_ < 0) {
				position_ += denominator_;
				cycles += 32;

				if(context.arguments & 0x1) {
					advance_axis<0, false>();
				} else {
					advance_axis<1, false>();
				}
			}
		}